

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON_ContentHash *
ON_ContentHash::CreateFromFile(ON_ContentHash *__return_storage_ptr__,char *filename)

{
  ON_SHA1_Hash sha1_file_name_hash_00;
  FILE *fp_00;
  FILE *fp;
  ON__UINT8 OStack_28;
  ON__UINT8 OStack_27;
  ON__UINT8 OStack_26;
  ON__UINT8 OStack_25;
  ON_SHA1_Hash sha1_file_name_hash;
  ON_ContentHash *pHash;
  char *filename_local;
  
  sha1_file_name_hash.m_digest._12_8_ = Cache::FromFile(filename);
  if ((ON_ContentHash *)sha1_file_name_hash.m_digest._12_8_ == (ON_ContentHash *)0x0) {
    if (filename == (char *)0x0) {
      fp._4_1_ = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      fp._5_1_ = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      fp._6_1_ = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      fp._7_1_ = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      OStack_28 = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      OStack_27 = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      OStack_26 = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      OStack_25 = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      sha1_file_name_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      sha1_file_name_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      sha1_file_name_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      sha1_file_name_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      sha1_file_name_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      sha1_file_name_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      sha1_file_name_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      sha1_file_name_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
      sha1_file_name_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      sha1_file_name_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      sha1_file_name_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      sha1_file_name_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
    }
    else {
      ON_SHA1_Hash::FileSystemPathHash((ON_SHA1_Hash *)((long)&fp + 4),filename);
    }
    fp_00 = ON_FileStream::Open(filename,"rb");
    sha1_file_name_hash_00.m_digest[8] = sha1_file_name_hash.m_digest[0];
    sha1_file_name_hash_00.m_digest[9] = sha1_file_name_hash.m_digest[1];
    sha1_file_name_hash_00.m_digest[10] = sha1_file_name_hash.m_digest[2];
    sha1_file_name_hash_00.m_digest[0xb] = sha1_file_name_hash.m_digest[3];
    sha1_file_name_hash_00.m_digest[0xc] = sha1_file_name_hash.m_digest[4];
    sha1_file_name_hash_00.m_digest[0xd] = sha1_file_name_hash.m_digest[5];
    sha1_file_name_hash_00.m_digest[0xe] = sha1_file_name_hash.m_digest[6];
    sha1_file_name_hash_00.m_digest[0xf] = sha1_file_name_hash.m_digest[7];
    sha1_file_name_hash_00.m_digest[0] = fp._4_1_;
    sha1_file_name_hash_00.m_digest[1] = fp._5_1_;
    sha1_file_name_hash_00.m_digest[2] = fp._6_1_;
    sha1_file_name_hash_00.m_digest[3] = fp._7_1_;
    sha1_file_name_hash_00.m_digest[4] = OStack_28;
    sha1_file_name_hash_00.m_digest[5] = OStack_27;
    sha1_file_name_hash_00.m_digest[6] = OStack_26;
    sha1_file_name_hash_00.m_digest[7] = OStack_25;
    sha1_file_name_hash_00.m_digest[0x10] = sha1_file_name_hash.m_digest[8];
    sha1_file_name_hash_00.m_digest[0x11] = sha1_file_name_hash.m_digest[9];
    sha1_file_name_hash_00.m_digest[0x12] = sha1_file_name_hash.m_digest[10];
    sha1_file_name_hash_00.m_digest[0x13] = sha1_file_name_hash.m_digest[0xb];
    CreateFromFile(__return_storage_ptr__,sha1_file_name_hash_00,fp_00);
    ON_FileStream::Close(fp_00);
    Cache::Add(filename,__return_storage_ptr__);
  }
  else {
    memcpy(__return_storage_ptr__,(void *)sha1_file_name_hash.m_digest._12_8_,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_ContentHash ON_ContentHash::CreateFromFile( 
  const char* filename
  )
{
  if (auto pHash = Cache::FromFile(filename))
  {
    return *pHash;
  }

  ON_SHA1_Hash sha1_file_name_hash = (nullptr == filename) ? ON_SHA1_Hash::ZeroDigest : ON_SHA1_Hash::FileSystemPathHash(filename);
  FILE* fp = ON_FileStream::Open(filename, "rb");
  ON_ContentHash hash = ON_ContentHash::CreateFromFile(sha1_file_name_hash,fp);
  ON_FileStream::Close(fp);

  Cache::Add(filename, hash);

  return hash;
}